

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_filter.c
# Opt level: O2

t_int * sigsamphold_perform(t_int *w)

{
  float fVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 uVar8;
  float fVar9;
  
  lVar2 = w[1];
  lVar3 = w[2];
  lVar4 = w[3];
  lVar5 = w[4];
  uVar8 = *(undefined4 *)(lVar5 + 0x38);
  uVar7 = 0;
  uVar6 = (ulong)*(uint *)(w + 5);
  fVar9 = *(float *)(lVar5 + 0x34);
  if ((int)*(uint *)(w + 5) < 1) {
    uVar6 = uVar7;
  }
  for (; (int)uVar6 != (int)uVar7; uVar7 = uVar7 + 1) {
    fVar1 = *(float *)(lVar3 + uVar7 * 4);
    if (fVar1 < fVar9) {
      uVar8 = *(undefined4 *)(lVar2 + uVar7 * 4);
    }
    *(undefined4 *)(lVar4 + uVar7 * 4) = uVar8;
    fVar9 = fVar1;
  }
  *(float *)(lVar5 + 0x34) = fVar9;
  *(undefined4 *)(lVar5 + 0x38) = uVar8;
  return w + 6;
}

Assistant:

static t_int *sigsamphold_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    t_sigsamphold *x = (t_sigsamphold *)(w[4]);
    int n = (int)w[5];
    int i;
    t_sample lastin = x->x_lastin;
    t_sample lastout = x->x_lastout;
    for (i = 0; i < n; i++, in1++)
    {
        t_sample next = *in2++;
        if (next < lastin) lastout = *in1;
        *out++ = lastout;
        lastin = next;
    }
    x->x_lastin = lastin;
    x->x_lastout = lastout;
    return (w+6);
}